

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

void __thiscall
Js::ScriptFunctionWithInlineCache::CreateInlineCache(ScriptFunctionWithInlineCache *this)

{
  uint32 uVar1;
  FunctionBody *this_00;
  
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
  uVar1 = FunctionBody::GetCountField(this_00,RootObjectLoadInlineCacheStart);
  this->rootObjectLoadInlineCacheStart = uVar1;
  uVar1 = FunctionBody::GetCountField(this_00,RootObjectStoreInlineCacheStart);
  this->rootObjectStoreInlineCacheStart = uVar1;
  uVar1 = FunctionBody::GetCountField(this_00,InlineCacheCount);
  this->inlineCacheCount = uVar1;
  uVar1 = FunctionBody::GetCountField(this_00,IsInstInlineCacheCount);
  this->isInstInlineCacheCount = uVar1;
  (this->super_ScriptFunction).hasInlineCaches = true;
  AllocateInlineCache(this);
  return;
}

Assistant:

void ScriptFunctionWithInlineCache::CreateInlineCache()
    {
        Js::FunctionBody *functionBody = this->GetFunctionBody();
        this->rootObjectLoadInlineCacheStart = functionBody->GetRootObjectLoadInlineCacheStart();
        this->rootObjectStoreInlineCacheStart = functionBody->GetRootObjectStoreInlineCacheStart();
        this->inlineCacheCount = functionBody->GetInlineCacheCount();
        this->isInstInlineCacheCount = functionBody->GetIsInstInlineCacheCount();

        SetHasInlineCaches(true);
        AllocateInlineCache();
    }